

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# injectionmanager.h
# Opt level: O3

void injection::InjectionManager::bind<ITest>(function<ITest_*()> *maker,InjectionScope scope)

{
  _Any_data local_40;
  _Manager_type local_30;
  InjectionEngine<ITest> local_20 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  std::function<ITest_*()>::function((function<ITest_*()> *)&local_40,maker);
  injection_private::InjectionEngine<ITest>::config
            (local_20,(function<ITest_*()> *)&local_40,SET,scope);
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  return;
}

Assistant:

static void bind(std::function<I*()> maker, InjectionScope scope) {
        static injection_private::InjectionEngine<I> phony;
        phony.config(maker, injection_private::InjectionCommand::SET, scope);
    }